

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTests.cpp
# Opt level: O0

void __thiscall
ModelTestFixture_testFindById_Test::TestBody(ModelTestFixture_testFindById_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  int id;
  Mock *rhs;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Mock object;
  ModelTestFixture_testFindById_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this_00 = &gtest_ar.message_;
  Mock::Mock((Mock *)this_00);
  Model<Mock>::save((Model<Mock> *)this_00);
  id = Model<Mock>::getId((Model<Mock> *)this_00);
  rhs = Model<Mock>::findById(id);
  testing::internal::EqHelper<false>::Compare<Mock,Mock>
            ((EqHelper<false> *)local_38,"object","*Mock::findById(object.getId())",(Mock *)this_00,
             rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/tests/base_tests/ModelTests.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST_F(ModelTestFixture, testFindById) {
    Mock object = Mock();
    object.save();
    ASSERT_EQ(object, *Mock::findById(object.getId()));
}